

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::type_t>::holder<cs::type_t&>(holder<cs::type_t> *this,type_t *args)

{
  type_t *in_RDI;
  type_t *in_stack_ffffffffffffffe0;
  
  baseHolder::baseHolder((baseHolder *)in_RDI);
  *(undefined ***)&(in_RDI->constructor).super__Function_base._M_functor = &PTR__holder_006c3410;
  cs::type_t::type_t(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}